

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV3MapBlock(Parser *this,Texture *map)

{
  bool bVar1;
  basic_formatter *this_00;
  Logger *pLVar2;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_70;
  undefined1 local_40 [8];
  string temp;
  bool parsePath;
  int iDepth;
  Texture *map_local;
  Parser *this_local;
  
  temp.field_2._12_4_ = 0;
  temp.field_2._M_local_buf[0xb] = '\x01';
  std::__cxx11::string::string((string *)local_40);
LAB_005cb0a2:
  do {
    while (*this->filePtr != '*') {
LAB_005cb4df:
      if (*this->filePtr == '{') {
        temp.field_2._12_4_ = temp.field_2._12_4_ + 1;
      }
      else if (*this->filePtr == '}') {
        temp.field_2._12_4_ = temp.field_2._12_4_ + -1;
        if (temp.field_2._12_4_ == 0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          std::__cxx11::string::~string((string *)local_40);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        LogError(this,"Encountered unexpected EOL while parsing a *MAP_XXXXXX chunk (Level 3)");
      }
      bVar1 = IsLineEnd<char>(*this->filePtr);
      if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = this->filePtr + 1;
    bVar1 = TokenMatch<char_const>(&this->filePtr,"MAP_CLASS",9);
    if (bVar1) {
      std::__cxx11::string::clear();
      bVar1 = ParseString(this,(string *)local_40,"*MAP_CLASS");
      if (!bVar1) {
        SkipToNextToken(this);
      }
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"Bitmap");
      if ((bVar1) &&
         (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"Normal Bump"), bVar1)) {
        pLVar2 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[33]>(&local_1e8,(char (*) [33])"ASE: Skipping unknown map type: ");
        this_00 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_1e8,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40);
        Formatter::basic_formatter::operator_cast_to_string(&local_70,this_00);
        Logger::warn(pLVar2,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_1e8);
        temp.field_2._M_local_buf[0xb] = '\0';
      }
      goto LAB_005cb0a2;
    }
    if (((temp.field_2._M_local_buf[0xb] & 1U) == 0) ||
       (bVar1 = TokenMatch<char_const>(&this->filePtr,"BITMAP",6), !bVar1)) {
      bVar1 = TokenMatch<char_const>(&this->filePtr,"UVW_U_OFFSET",0xc);
      if (bVar1) {
        ParseLV4MeshFloat(this,&map->mOffsetU);
      }
      else {
        bVar1 = TokenMatch<char_const>(&this->filePtr,"UVW_V_OFFSET",0xc);
        if (bVar1) {
          ParseLV4MeshFloat(this,&map->mOffsetV);
        }
        else {
          bVar1 = TokenMatch<char_const>(&this->filePtr,"UVW_U_TILING",0xc);
          if (bVar1) {
            ParseLV4MeshFloat(this,&map->mScaleU);
          }
          else {
            bVar1 = TokenMatch<char_const>(&this->filePtr,"UVW_V_TILING",0xc);
            if (bVar1) {
              ParseLV4MeshFloat(this,&map->mScaleV);
            }
            else {
              bVar1 = TokenMatch<char_const>(&this->filePtr,"UVW_ANGLE",9);
              if (bVar1) {
                ParseLV4MeshFloat(this,&map->mRotation);
              }
              else {
                bVar1 = TokenMatch<char_const>(&this->filePtr,"MAP_AMOUNT",10);
                if (!bVar1) goto LAB_005cb4df;
                ParseLV4MeshFloat(this,&map->mTextureBlend);
              }
            }
          }
        }
      }
    }
    else {
      bVar1 = ParseString(this,&map->mMapName,"*BITMAP");
      if (!bVar1) {
        SkipToNextToken(this);
      }
      bVar1 = std::operator==(&map->mMapName,"None");
      if (bVar1) {
        pLVar2 = DefaultLogger::get();
        Logger::warn(pLVar2,"ASE: Skipping invalid map entry");
        std::__cxx11::string::operator=((string *)&map->mMapName,"");
      }
    }
  } while( true );
}

Assistant:

void Parser::ParseLV3MapBlock(Texture& map)
{
    AI_ASE_PARSER_INIT();

    // ***********************************************************
    // *BITMAP should not be there if *MAP_CLASS is not BITMAP,
    // but we need to expect that case ... if the path is
    // empty the texture won't be used later.
    // ***********************************************************
    bool parsePath = true;
    std::string temp;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            // type of map
            if (TokenMatch(filePtr,"MAP_CLASS" ,9))
            {
                temp.clear();
                if(!ParseString(temp,"*MAP_CLASS"))
                    SkipToNextToken();
                if (temp != "Bitmap" && temp != "Normal Bump")
                {
                    ASSIMP_LOG_WARN_F("ASE: Skipping unknown map type: ", temp);
                    parsePath = false;
                }
                continue;
            }
            // path to the texture
            if (parsePath && TokenMatch(filePtr,"BITMAP" ,6))
            {
                if(!ParseString(map.mMapName,"*BITMAP"))
                    SkipToNextToken();

                if (map.mMapName == "None")
                {
                    // Files with 'None' as map name are produced by
                    // an Maja to ASE exporter which name I forgot ..
                    ASSIMP_LOG_WARN("ASE: Skipping invalid map entry");
                    map.mMapName = "";
                }

                continue;
            }
            // offset on the u axis
            if (TokenMatch(filePtr,"UVW_U_OFFSET" ,12))
            {
                ParseLV4MeshFloat(map.mOffsetU);
                continue;
            }
            // offset on the v axis
            if (TokenMatch(filePtr,"UVW_V_OFFSET" ,12))
            {
                ParseLV4MeshFloat(map.mOffsetV);
                continue;
            }
            // tiling on the u axis
            if (TokenMatch(filePtr,"UVW_U_TILING" ,12))
            {
                ParseLV4MeshFloat(map.mScaleU);
                continue;
            }
            // tiling on the v axis
            if (TokenMatch(filePtr,"UVW_V_TILING" ,12))
            {
                ParseLV4MeshFloat(map.mScaleV);
                continue;
            }
            // rotation around the z-axis
            if (TokenMatch(filePtr,"UVW_ANGLE" ,9))
            {
                ParseLV4MeshFloat(map.mRotation);
                continue;
            }
            // map blending factor
            if (TokenMatch(filePtr,"MAP_AMOUNT" ,10))
            {
                ParseLV4MeshFloat(map.mTextureBlend);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MAP_XXXXXX");
    }
    return;
}